

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

string * str_replPers(string *s)

{
  int iVar1;
  string *in_RDI;
  string asStackY_78 [32];
  string local_58 [28];
  flag_type in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  match_flag_type in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  if (str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reEMail_abi_cxx11_);
    }
  }
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if (str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reHome_abi_cxx11_);
    }
  }
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4);
  std::__cxx11::string::operator=((string *)in_RDI,local_58);
  std::__cxx11::string::~string(local_58);
  if (str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&str_replPers(std::__cxx11::string&)::reUsers_abi_cxx11_);
    }
  }
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd4);
  std::__cxx11::string::operator=((string *)in_RDI,asStackY_78);
  std::__cxx11::string::~string(asStackY_78);
  return in_RDI;
}

Assistant:

std::string& str_replPers (std::string& s)
{
    // replace email addresses
    static std::regex reEMail("\\b[A-Z0-9._%+-]+@[A-Z0-9.-]+\\.[A-Z]{2,}\\b", std::regex::icase);
    s = std::regex_replace(s, reEMail, "[email@ano.nym]");
    
    // Replace user's directory name in Linux
    static std::regex reHome("\\/home\\/[-_\\.a-z]+\\/", std::regex::icase);
    s = std::regex_replace(s, reHome, "/home/[user]/");

    // Replace user's directory name in MacOS or Windows
    static std::regex reUsers("[\\/\\\\]Users[\\/\\\\][-_\\.a-z]+[\\/\\\\]", std::regex::icase);
    s = std::regex_replace(s, reUsers, "/Users/[user]/");

    return s;
}